

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

int CVmObjByteArray::static_packBytes(vm_val_t *retval,uint *oargc)

{
  ulong uVar1;
  int iVar2;
  vm_obj_id_t obj;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  int *in_RSI;
  vm_val_t *in_RDI;
  CVmObjByteArray *arr;
  long len;
  err_frame_t err_cur__;
  CVmMemorySource *dst;
  uint argc;
  CVmNativeCodeDesc *in_stack_fffffffffffffea8;
  void *pvVar6;
  uint *in_stack_fffffffffffffeb0;
  int in_root_set;
  undefined8 uVar7;
  vm_val_t *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffed0;
  int n;
  int iVar8;
  uint local_118 [3];
  void *in_stack_fffffffffffffef8;
  unsigned_long in_stack_ffffffffffffff00;
  CVmDataSource *in_stack_ffffffffffffff08;
  vm_obj_id_t in_stack_ffffffffffffff14;
  CVmObjByteArray *in_stack_ffffffffffffff18;
  CVmDataSource *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  
  if (in_RSI == (int *)0x0) {
    n = 0;
  }
  else {
    n = *in_RSI;
  }
  iVar8 = n;
  if ((static_packBytes(vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&static_packBytes(vm_val_t*,unsigned_int*)::desc), iVar2 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&static_packBytes::desc,1,0,1);
    __cxa_guard_release(&static_packBytes(vm_val_t*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc
                    (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  in_root_set = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  if (iVar2 == 0) {
    plVar3 = (long *)operator_new(0x10);
    CVmMemorySource::CVmMemorySource
              ((CVmMemorySource *)CONCAT44(iVar8,in_stack_fffffffffffffed0),(long)plVar3);
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    unique0x00012000 = *puVar4;
    plVar5 = (long *)_ZTW11G_err_frame();
    *plVar5 = (long)local_118;
    local_118[0] = _setjmp((__jmp_buf_tag *)&stack0xffffffffffffff00);
    if (local_118[0] == 0) {
      CVmPack::pack(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      (**(code **)(*plVar3 + 0x30))();
      obj = create(in_root_set,(unsigned_long)in_stack_fffffffffffffea8);
      vm_val_t::set_obj(in_RDI,obj);
      vm_objp(0);
      (**(code **)(*plVar3 + 0x40))(plVar3,0,0);
      uVar7 = stack0xfffffffffffffef0;
      uVar1 = (ulong)stack0xfffffffffffffef0 >> 0x20;
      iVar8 = (int)uVar1;
      unique0x10000324 = uVar7;
      read_from_file(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,in_stack_ffffffffffffff08,
                     in_stack_ffffffffffffff00,(unsigned_long)in_stack_fffffffffffffef8,iVar8);
    }
    if (((local_118[0] & 0x8000) == 0) &&
       (local_118[0] = local_118[0] | 0x8000, plVar3 != (long *)0x0)) {
      (**(code **)(*plVar3 + 8))();
    }
    uVar7 = stack0xfffffffffffffef0;
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    *puVar4 = uVar7;
    if ((local_118[0] & 0x4001) != 0) {
      puVar4 = (undefined8 *)_ZTW11G_err_frame();
      pvVar6 = in_stack_fffffffffffffef8;
      if ((*(uint *)*puVar4 & 2) != 0) {
        plVar3 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar3 + 0x10));
        pvVar6 = in_stack_fffffffffffffef8;
      }
      in_stack_fffffffffffffef8 = pvVar6;
      plVar3 = (long *)_ZTW11G_err_frame();
      *(void **)(*plVar3 + 0x10) = pvVar6;
      err_rethrow();
    }
    if ((local_118[0] & 2) != 0) {
      free(in_stack_fffffffffffffef8);
    }
    CVmStack::discard(n);
  }
  return 1;
}

Assistant:

int CVmObjByteArray::static_packBytes(VMG_ vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = oargc != 0 ? *oargc : 0;
    static CVmNativeCodeDesc desc(1, 0, TRUE);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* set up an in-memory data stream to receive the packed data */
    CVmMemorySource *dst = new CVmMemorySource(0L);

    err_try
    {
        /* do the packing */
        CVmPack::pack(vmg_ 0, argc, dst);

        /* create a byte array to hold the packed data */
        long len = dst->get_size();
        retval->set_obj(create(vmg_ FALSE, len));
        CVmObjByteArray *arr = (CVmObjByteArray *)vm_objp(vmg_ retval->val.obj);

        /* 
         *   copy the bytes from the stream to the byte array; it's a new
         *   object, so there's no undo to save 
         */
        dst->seek(0, OSFSK_SET);
        arr->read_from_file(vmg_ retval->val.obj, dst, 1, len, FALSE);
    }